

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildBrReg1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,uint targetOffset,RegSlot srcRegSlot)

{
  int iVar1;
  RegOpnd *srcOpnd_00;
  ScriptContextInfo *pSVar2;
  undefined4 extraout_var;
  AddrOpnd *src2Opnd;
  AddrOpnd *srcOpnd2;
  RegOpnd *srcOpnd;
  BranchInstr *branchInstr;
  RegSlot srcRegSlot_local;
  uint targetOffset_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  srcOpnd_00 = BuildSrcOpnd(this,srcRegSlot,TyVar);
  if (newOpcode == BrNotUndecl_A) {
    pSVar2 = Func::GetScriptContextInfo(this->m_func);
    iVar1 = (*pSVar2->_vptr_ScriptContextInfo[4])();
    src2Opnd = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar1),AddrOpndKindDynamicVar,this->m_func,
                                 false,(Var)0x0);
    srcOpnd = (RegOpnd *)
              IR::BranchInstr::New
                        (BrNotAddr_A,(LabelInstr *)0x0,&srcOpnd_00->super_Opnd,&src2Opnd->super_Opnd
                         ,this->m_func);
  }
  else {
    srcOpnd = (RegOpnd *)
              IR::BranchInstr::New(newOpcode,(LabelInstr *)0x0,&srcOpnd_00->super_Opnd,this->m_func)
    ;
  }
  AddBranchInstr(this,(BranchInstr *)srcOpnd,offset,targetOffset);
  return;
}

Assistant:

void
IRBuilder::BuildBrReg1(Js::OpCode newOpcode, uint32 offset, uint targetOffset, Js::RegSlot srcRegSlot)
{
    IR::BranchInstr * branchInstr;
    IR::RegOpnd *     srcOpnd;
    srcOpnd = this->BuildSrcOpnd(srcRegSlot);

    if (newOpcode == Js::OpCode::BrNotUndecl_A) {
        IR::AddrOpnd *srcOpnd2 = IR::AddrOpnd::New(m_func->GetScriptContextInfo()->GetUndeclBlockVarAddr(),
            IR::AddrOpndKindDynamicVar, this->m_func);
        branchInstr = IR::BranchInstr::New(Js::OpCode::BrNotAddr_A, nullptr, srcOpnd, srcOpnd2, m_func);
    } else {
        branchInstr = IR::BranchInstr::New(newOpcode, nullptr, srcOpnd, m_func);
    }

    this->AddBranchInstr(branchInstr, offset, targetOffset);
}